

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderLoader.cpp
# Opt level: O2

void __thiscall
Assimp::BlenderImporter::InternReadFile
          (BlenderImporter *this,string *pFile,aiScene *pScene,IOSystem *pIOHandler)

{
  size_type __new_size;
  int iVar1;
  uint uVar2;
  undefined4 extraout_var;
  StreamReader<false,_false> *this_00;
  MemoryIOStream *__p;
  char *pcVar3;
  char *pcVar4;
  BlenderImporter *pBVar5;
  uint uVar6;
  size_type sVar7;
  allocator local_6a1;
  char magic [8];
  shared_ptr<Assimp::IOStream> stream;
  vector<unsigned_char,_std::allocator<unsigned_char>_> uncompressed;
  shared_ptr<Assimp::StreamReader<false,_false>_> reader;
  undefined1 local_650 [16];
  string local_640;
  __shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2> local_620;
  int8_t *local_610;
  int local_608;
  Scene *local_5f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5f0 [2];
  undefined8 uStack_5d0;
  undefined4 uStack_5c8;
  undefined4 local_5c4;
  undefined4 uStack_5c0;
  undefined8 uStack_5bc;
  FileDatabase file;
  Scene scene;
  
  uncompressed.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  uncompressed.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  uncompressed.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Blender::FileDatabase::FileDatabase(&file);
  std::__cxx11::string::string((string *)&scene,"rb",(allocator *)&local_610);
  iVar1 = (*pIOHandler->_vptr_IOSystem[4])
                    (pIOHandler,(pFile->_M_dataplus)._M_p,scene.super_ElemBase._vptr_ElemBase);
  std::__shared_ptr<Assimp::IOStream,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<Assimp::IOStream,void>
            ((__shared_ptr<Assimp::IOStream,(__gnu_cxx::_Lock_policy)2> *)&stream,
             (IOStream *)CONCAT44(extraout_var,iVar1));
  std::__cxx11::string::~string((string *)&scene);
  if (stream.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    std::__cxx11::string::string
              ((string *)&scene,"Could not open file for reading",(allocator *)&local_610);
    LogFunctions<Assimp::BlenderImporter>::ThrowException((string *)&scene);
    std::__cxx11::string::~string((string *)&scene);
  }
  magic[0] = '\0';
  magic[1] = '\0';
  magic[2] = '\0';
  magic[3] = '\0';
  magic[4] = '\0';
  magic[5] = '\0';
  magic[6] = '\0';
  magic[7] = '\0';
  (*(stream.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_vptr_IOStream
    [2])(stream.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_ptr,magic,7,1);
  if (magic != (char  [8])0x5245444e454c42) {
    if ((magic[0] != '\x1f') || (magic[1] != -0x75)) {
      std::__cxx11::string::string
                ((string *)&scene,
                 "BLENDER magic bytes are missing, couldn\'t find GZIP header either",
                 (allocator *)&local_610);
      LogFunctions<Assimp::BlenderImporter>::ThrowException((string *)&scene);
      std::__cxx11::string::~string((string *)&scene);
    }
    LogFunctions<Assimp::BlenderImporter>::LogDebug((char *)0x455e15);
    if (magic[2] != '\b') {
      std::__cxx11::string::string
                ((string *)&scene,"Unsupported GZIP compression method",(allocator *)&local_610);
      LogFunctions<Assimp::BlenderImporter>::ThrowException((string *)&scene);
      std::__cxx11::string::~string((string *)&scene);
    }
    (*(stream.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      _vptr_IOStream[4])
              (stream.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_ptr,0,0);
    this_00 = (StreamReader<false,_false> *)operator_new(0x38);
    std::__shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_620,&stream.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>);
    StreamReader<false,_false>::StreamReader
              (this_00,(shared_ptr<Assimp::IOStream> *)&local_620,false);
    std::__shared_ptr<Assimp::StreamReader<false,false>,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<Assimp::StreamReader<false,false>,void>
              ((__shared_ptr<Assimp::StreamReader<false,false>,(__gnu_cxx::_Lock_policy)2> *)&reader
               ,this_00);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_620._M_refcount);
    uStack_5c0 = 0;
    uStack_5bc = 0;
    uStack_5d0 = 0;
    uStack_5c8 = 0;
    local_5c4 = 0;
    inflateInit2_(&local_610,0x1f,"1.2.11",0x70);
    local_610 = (reader.
                 super___shared_ptr<Assimp::StreamReader<false,_false>,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->current;
    local_608 = *(int *)&(reader.
                          super___shared_ptr<Assimp::StreamReader<false,_false>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr)->end - (int)local_610;
    sVar7 = 0;
    do {
      local_5f8 = &scene;
      local_5f0[0]._M_allocated_capacity._0_4_ = 0x400;
      uVar2 = inflate(&local_610,0);
      if (1 < uVar2) {
        std::__cxx11::string::string
                  ((string *)&local_640,
                   "Failure decompressing this file using gzip, seemingly it is NOT a compressed .BLEND file"
                   ,&local_6a1);
        LogFunctions<Assimp::BlenderImporter>::ThrowException(&local_640);
        std::__cxx11::string::~string((string *)&local_640);
      }
      uVar6 = 0x400 - local_5f0[0]._0_4_;
      __new_size = uVar6 + sVar7;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&uncompressed,__new_size);
      memcpy(uncompressed.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start + sVar7,&scene,(ulong)uVar6);
      sVar7 = __new_size;
    } while (uVar2 != 1);
    inflateEnd(&local_610);
    __p = (MemoryIOStream *)Intern::AllocateFromAssimpHeap::operator_new(0x28);
    (__p->super_IOStream)._vptr_IOStream = (_func_int **)&PTR__MemoryIOStream_0071b5c0;
    __p->buffer = uncompressed.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start;
    __p->length = __new_size;
    __p->pos = 0;
    __p->own = false;
    std::__shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>::reset<Assimp::MemoryIOStream>
              (&stream.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>,__p);
    (*(stream.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      _vptr_IOStream[2])
              (stream.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_ptr,magic,
               7,1);
    if (magic != (char  [8])0x5245444e454c42) {
      std::__cxx11::string::string
                ((string *)&local_640,"Found no BLENDER magic word in decompressed GZIP file",
                 &local_6a1);
      LogFunctions<Assimp::BlenderImporter>::ThrowException(&local_640);
      std::__cxx11::string::~string((string *)&local_640);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&reader.
                super___shared_ptr<Assimp::StreamReader<false,_false>,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  (*(stream.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_vptr_IOStream
    [2])(stream.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_ptr,magic,1);
  file.i64bit = magic[0] == '-';
  (*(stream.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_vptr_IOStream
    [2])(stream.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_ptr,magic,1);
  file.little = magic[0] == 'v';
  (*(stream.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_vptr_IOStream
    [2])(stream.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_ptr,magic,3,1);
  magic[3] = '\0';
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&scene);
  std::operator<<((ostream *)&scene,"Blender version is ");
  std::operator<<((ostream *)&scene,magic[0]);
  std::operator<<((ostream *)&scene,".");
  std::operator<<((ostream *)&scene,magic + 1);
  std::operator<<((ostream *)&scene," (64bit: ");
  pcVar3 = "false";
  pcVar4 = "false";
  if (file.i64bit != false) {
    pcVar4 = "true";
  }
  std::operator<<((ostream *)&scene,pcVar4);
  std::operator<<((ostream *)&scene,", little endian: ");
  if (file.little != false) {
    pcVar3 = "true";
  }
  std::operator<<((ostream *)&scene,pcVar3);
  std::operator<<((ostream *)&scene,")");
  LogFunctions<Assimp::BlenderImporter>::LogInfo((format *)&scene);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&scene);
  pBVar5 = (BlenderImporter *)local_650;
  std::__shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2> *)local_650,
             &stream.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>);
  ParseBlendFile(pBVar5,&file,(shared_ptr<Assimp::IOStream> *)local_650);
  pBVar5 = (BlenderImporter *)(local_650 + 8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)pBVar5);
  scene.super_ElemBase.dna_type = (char *)0x0;
  scene.super_ElemBase._vptr_ElemBase = (_func_int **)&PTR__Scene_0071fdb8;
  scene.id.super_ElemBase.dna_type = (char *)0x0;
  scene.id.super_ElemBase._vptr_ElemBase = (_func_int **)&PTR__ElemBase_0071fdf0;
  scene.base.super_ElemBase.dna_type = (char *)0x0;
  scene.camera.super___shared_ptr<Assimp::Blender::Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  scene.camera.super___shared_ptr<Assimp::Blender::Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  scene.world.super___shared_ptr<Assimp::Blender::World,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  scene.world.super___shared_ptr<Assimp::Blender::World,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  scene.basact.super___shared_ptr<Assimp::Blender::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  scene.basact.super___shared_ptr<Assimp::Blender::Base,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  scene.base.super_ElemBase._vptr_ElemBase = (_func_int **)&PTR__ListBase_0071fe28;
  scene.base.first.super___shared_ptr<Assimp::Blender::ElemBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  scene.base.first.super___shared_ptr<Assimp::Blender::ElemBase,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  scene.base.last.super___shared_ptr<Assimp::Blender::ElemBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  scene.base.last.super___shared_ptr<Assimp::Blender::ElemBase,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  ExtractScene(pBVar5,&scene,&file);
  ConvertBlendFile(this,pScene,&scene,&file);
  Blender::Scene::~Scene(&scene);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&stream.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  Blender::FileDatabase::~FileDatabase(&file);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&uncompressed.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return;
}

Assistant:

void BlenderImporter::InternReadFile( const std::string& pFile,
    aiScene* pScene, IOSystem* pIOHandler)
{
#ifndef ASSIMP_BUILD_NO_COMPRESSED_BLEND
    std::vector<Bytef> uncompressed;
#endif


    FileDatabase file;
    std::shared_ptr<IOStream> stream(pIOHandler->Open(pFile,"rb"));
    if (!stream) {
        ThrowException("Could not open file for reading");
    }

    char magic[8] = {0};
    stream->Read(magic,7,1);
    if (strcmp(magic, Tokens[0] )) {
        // Check for presence of the gzip header. If yes, assume it is a
        // compressed blend file and try uncompressing it, else fail. This is to
        // avoid uncompressing random files which our loader might end up with.
#ifdef ASSIMP_BUILD_NO_COMPRESSED_BLEND
        ThrowException("BLENDER magic bytes are missing, is this file compressed (Assimp was built without decompression support)?");
#else

        if (magic[0] != 0x1f || static_cast<uint8_t>(magic[1]) != 0x8b) {
            ThrowException("BLENDER magic bytes are missing, couldn't find GZIP header either");
        }

        LogDebug("Found no BLENDER magic word but a GZIP header, might be a compressed file");
        if (magic[2] != 8) {
            ThrowException("Unsupported GZIP compression method");
        }

        // http://www.gzip.org/zlib/rfc-gzip.html#header-trailer
        stream->Seek(0L,aiOrigin_SET);
        std::shared_ptr<StreamReaderLE> reader = std::shared_ptr<StreamReaderLE>(new StreamReaderLE(stream));

        // build a zlib stream
        z_stream zstream;
        zstream.opaque = Z_NULL;
        zstream.zalloc = Z_NULL;
        zstream.zfree  = Z_NULL;
        zstream.data_type = Z_BINARY;

        // http://hewgill.com/journal/entries/349-how-to-decompress-gzip-stream-with-zlib
        inflateInit2(&zstream, 16+MAX_WBITS);

        zstream.next_in   = reinterpret_cast<Bytef*>( reader->GetPtr() );
        zstream.avail_in  = reader->GetRemainingSize();

        size_t total = 0l;

        // TODO: be smarter about this, decompress directly into heap buffer
        // and decompress the data .... do 1k chunks in the hope that we won't kill the stack
#define MYBLOCK 1024
        Bytef block[MYBLOCK];
        int ret;
        do {
            zstream.avail_out = MYBLOCK;
            zstream.next_out = block;
            ret = inflate(&zstream, Z_NO_FLUSH);

            if (ret != Z_STREAM_END && ret != Z_OK) {
                ThrowException("Failure decompressing this file using gzip, seemingly it is NOT a compressed .BLEND file");
            }
            const size_t have = MYBLOCK - zstream.avail_out;
            total += have;
            uncompressed.resize(total);
            memcpy(uncompressed.data() + total - have,block,have);
        }
        while (ret != Z_STREAM_END);

        // terminate zlib
        inflateEnd(&zstream);

        // replace the input stream with a memory stream
        stream.reset(new MemoryIOStream(reinterpret_cast<uint8_t*>(uncompressed.data()),total));

        // .. and retry
        stream->Read(magic,7,1);
        if (strcmp(magic,"BLENDER")) {
            ThrowException("Found no BLENDER magic word in decompressed GZIP file");
        }
#endif
    }

    file.i64bit = (stream->Read(magic,1,1),magic[0]=='-');
    file.little = (stream->Read(magic,1,1),magic[0]=='v');

    stream->Read(magic,3,1);
    magic[3] = '\0';

    LogInfo((format(),"Blender version is ",magic[0],".",magic+1,
        " (64bit: ",file.i64bit?"true":"false",
        ", little endian: ",file.little?"true":"false",")"
    ));

    ParseBlendFile(file,stream);

    Scene scene;
    ExtractScene(scene,file);

    ConvertBlendFile(pScene,scene,file);
}